

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.h
# Opt level: O0

void __thiscall adios2::query::Worker::Worker(Worker *this,Worker *other)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = __cxa_atexit;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  in_RDI[5] = *(undefined8 *)(in_RSI + 0x28);
  in_RDI[6] = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)(in_RSI + 0x30) = 0;
  return;
}

Assistant:

Worker(Worker &&other)
    {
        this->m_QueryFile = other.m_QueryFile;
        this->m_SourceReader = other.m_SourceReader;
        this->m_Query = other.m_Query;
        other.m_Query = nullptr;
    }